

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::pp_include(CTcTokenizer *this)

{
  utf8_ptr *this_00;
  char *pcVar1;
  CTcTokStream *pCVar2;
  byte bVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  int iVar8;
  size_t sVar9;
  CTcSrcFile *pCVar10;
  size_t orig_fname_len;
  CTcTokFileDesc *pCVar11;
  CTcTokStream *pCVar12;
  ulong uVar13;
  char *pcVar14;
  CTcTokenizer *this_01;
  CTcTokStream **ppCVar15;
  tctok_incpath_t *ptVar16;
  int default_charset_error;
  char full_name [4096];
  int charset_error;
  char lcl_name [4096];
  
  this_00 = &this->p_;
  pcVar14 = (this->p_).p_;
  while( true ) {
    wVar4 = utf8_ptr::getch(this_00);
    iVar5 = is_space(wVar4);
    if (iVar5 == 0) break;
    utf8_ptr::inc(this_00);
  }
  wVar4 = utf8_ptr::getch(this_00);
  if (wVar4 == L'<') {
    wVar4 = L'>';
LAB_00219ab0:
    do {
      utf8_ptr::inc(this_00);
      wVar6 = utf8_ptr::getch(this_00);
      if (wVar6 == L'\0') break;
      wVar6 = utf8_ptr::getch(this_00);
    } while (wVar6 != wVar4);
    wVar6 = utf8_ptr::getch(this_00);
    if (wVar6 != wVar4) goto LAB_00219b08;
    do {
      utf8_ptr::inc(this_00);
      wVar4 = utf8_ptr::getch(this_00);
      iVar5 = is_space(wVar4);
    } while (iVar5 != 0);
    wVar4 = utf8_ptr::getch(this_00);
    this_00->p_ = pcVar14;
    if (wVar4 != L'\0') goto LAB_00219b0b;
  }
  else {
    if (wVar4 == L'\"') {
      wVar4 = L'\"';
      goto LAB_00219ab0;
    }
LAB_00219b08:
    this_00->p_ = pcVar14;
LAB_00219b0b:
    this_01 = this;
    iVar5 = expand_macros_curline(this,0,0,0);
    if (iVar5 != 0) goto LAB_00219cd2;
    remove_expansion_flags(this_01,&this->expbuf_);
    this->curbuf_ = &this->expbuf_;
    (this->p_).p_ = (this->expbuf_).buf_;
  }
  while( true ) {
    wVar4 = utf8_ptr::getch(this_00);
    iVar5 = is_space(wVar4);
    if (iVar5 == 0) break;
    utf8_ptr::inc(this_00);
  }
  wVar4 = utf8_ptr::getch(this_00);
  if (wVar4 == L'\"') {
    wVar6 = L'\"';
LAB_00219b86:
    utf8_ptr::inc(this_00);
    pcVar14 = this_00->p_;
    while ((wVar7 = utf8_ptr::getch(this_00), wVar7 != L'\0' &&
           (wVar7 = utf8_ptr::getch(this_00), wVar7 != wVar6))) {
      utf8_ptr::inc(this_00);
    }
    wVar6 = utf8_ptr::getch(this_00);
    if (wVar6 != L'\0') {
      pcVar1 = this_00->p_;
      do {
        utf8_ptr::inc(this_00);
        wVar6 = utf8_ptr::getch(this_00);
        iVar5 = is_space(wVar6);
      } while (iVar5 != 0);
      wVar6 = utf8_ptr::getch(this_00);
      if (wVar6 != L'\0') {
        log_warning(0x274c);
      }
      *pcVar1 = '\0';
      iVar5 = os_is_file_absolute(pcVar14);
      os_cvt_url_dir(lcl_name,0x1000,pcVar14);
      if ((wVar4 == L'\"') && (this->last_desc_ != (CTcTokFileDesc *)0x0)) {
        ppCVar15 = &this->str_;
        while (pCVar2 = *ppCVar15, pCVar2 != (CTcTokStream *)0x0) {
          os_get_path_name((char *)&charset_error,0x1000,this->last_desc_->fname_);
          os_build_full_path(full_name,0x1000,(char *)&charset_error,lcl_name);
          iVar8 = access(full_name,0);
          if (iVar8 == 0) goto LAB_00219d53;
          if (iVar5 == 0) {
            os_build_full_path(full_name,0x1000,(char *)&charset_error,pcVar14);
            iVar8 = access(full_name,0);
            if (iVar8 == 0) goto LAB_00219d53;
          }
          ppCVar15 = &pCVar2->parent_;
        }
      }
      ptVar16 = (tctok_incpath_t *)&this->incpath_head_;
      do {
        do {
          ptVar16 = ptVar16->nxt;
          if (ptVar16 == (tctok_incpath_t *)0x0) {
            if (iVar5 == 0) {
              clear_linebuf(this);
            }
            else {
              strcpy(full_name,pcVar14);
              iVar5 = access(full_name,0);
              clear_linebuf(this);
              if (iVar5 == 0) goto LAB_00219d5f;
            }
            uVar13 = strlen(pcVar14);
            goto LAB_00219e32;
          }
          os_build_full_path(full_name,0x1000,ptVar16->path,lcl_name);
          iVar8 = access(full_name,0);
          if (iVar8 == 0) goto LAB_00219d53;
        } while (iVar5 != 0);
        os_build_full_path(full_name,0x1000,ptVar16->path,pcVar14);
        iVar8 = access(full_name,0);
      } while (iVar8 != 0);
LAB_00219d53:
      clear_linebuf(this);
LAB_00219d5f:
      iVar5 = find_include_once(this,full_name);
      if (iVar5 == 0) {
        pCVar10 = CTcSrcFile::open_source
                            (full_name,this->res_loader_,this->default_charset_,&charset_error,
                             &default_charset_error);
        if (pCVar10 == (CTcSrcFile *)0x0) {
          if (default_charset_error == 0) {
            pcVar14 = full_name;
            uVar13 = strlen(pcVar14);
LAB_00219e32:
            log_error(0x2716,uVar13 & 0xffffffff,pcVar14);
          }
          else {
            log_error(0x2748,this->default_charset_);
          }
        }
        else {
          sVar9 = strlen(full_name);
          if (pcVar14 == (char *)0x0) {
            orig_fname_len = 0;
          }
          else {
            orig_fname_len = strlen(pcVar14);
          }
          pCVar11 = get_file_desc(this,full_name,sVar9,0,pcVar14,orig_fname_len);
          this->str_->newline_spacing_ = this->string_newline_spacing_;
          pCVar12 = (CTcTokStream *)operator_new(0x30);
          pCVar2 = this->str_;
          iVar5 = this->if_sp_;
          pCVar12->src_ = &pCVar10->super_CTcSrcObject;
          pCVar12->desc_ = pCVar11;
          pCVar12->parent_ = pCVar2;
          pCVar12->next_linenum_ = 1;
          pCVar12->field_0x28 = (byte)charset_error & 1;
          pCVar12->init_if_level_ = iVar5;
          this->str_ = pCVar12;
          bVar3 = *(byte *)this;
          if ((bVar3 & 1) != 0) {
            add_include_once(this,full_name);
            bVar3 = *(byte *)this;
          }
          if ((bVar3 & 0x10) != 0) {
            CTcHostIfc::print_msg(G_hostifc,"#include %s\n",full_name);
          }
        }
      }
      else if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x2) !=
               (undefined1  [3440])0x0) {
        sVar9 = strlen(full_name);
        log_warning(0x2717,sVar9 & 0xffffffff,full_name);
      }
      return;
    }
  }
  else {
    wVar6 = utf8_ptr::getch(this_00);
    if (wVar6 == L'<') {
      wVar6 = L'>';
      goto LAB_00219b86;
    }
  }
  log_error(0x2715);
LAB_00219cd2:
  clear_linebuf(this);
  return;
}

Assistant:

void CTcTokenizer::pp_include()
{
    wchar_t match;
    int is_local;
    int is_absolute;
    utf8_ptr fname;
    CTcSrcFile *new_src;
    int charset_error;
    int default_charset_error;
    char full_name[OSFNMAX];
    char lcl_name[OSFNMAX];
    int found;
    CTcTokFileDesc *desc;
    int expand;
    utf8_ptr start;

    /* presume we'll expand macros */
    expand = TRUE;

    /*
     *   Check to see if expansion is needed.  Macro expansion is needed
     *   only if the source line is not of one of the following forms:
     *   
     *.  #include "filename"
     *.  #include <filename> 
     */
    for (start = p_ ; is_space(p_.getch()) ; p_.inc()) ;
    switch(p_.getch())
    {
    case '<':
        /* look for a matching '>' */
        match = '>';
        goto find_match;

    case '"':
        /* look for a matching '"' */
        match = '"';
        goto find_match;

    find_match:
        /* find the matching character */
        for (p_.inc() ; p_.getch() != '\0' && p_.getch() != match ;
             p_.inc()) ;

        /* if we found it, check for other characters on the line */
        if (p_.getch() == match)
        {
            /* skip the matching character */
            p_.inc();

            /* skip whitespace */
            while (is_space(p_.getch()))
                p_.inc();

            /* 
             *   make sure there's nothing else on the line - if not, it's
             *   one of the approved formats, so there's no need to do
             *   macro expansion 
             */
            if (p_.getch() == 0)
                expand = FALSE;
        }
        break;
    }

    /* go back to read from the original starting point */
    p_ = start;
    
    /* expand macros if necessary */
    if (expand)
    {
        /* do the expansion */
        if (expand_macros_curline(FALSE, FALSE, FALSE))
        {
            /* clear the buffer and abort */
            clear_linebuf();
            return;
        }

        /* 
         *   remove any expansion flags, so that we don't have to worry about
         *   parsing or skipping them
         */
        remove_expansion_flags(&expbuf_);

        /* read from the expansion buffer */
        start_new_line(&expbuf_, 0);
    }

    /* skip leading whitespace */
    for ( ; is_space(p_.getch()) ; p_.inc()) ;

    /* we have to be looking at at '"' or '<' character */
    if (p_.getch() == '"')
    {
        /* look for a matching quote, and look for a local file */
        match = '"';
        is_local = TRUE;
    }
    else if (p_.getch() == '<')
    {
        /* look for a matching angle bracket, and look for a system file */
        match = '>';
        is_local = FALSE;
    }
    else
    {
        /* invalid syntax - log an error and ignore the line */
        log_error(TCERR_BAD_INC_SYNTAX);
        clear_linebuf();
        return;
    }

    /* skip the open quote, and remember where the filename starts */
    p_.inc();
    fname = p_;

    /* find the matching quote */
    for ( ; p_.getch() != '\0' && p_.getch() != match ; p_.inc()) ;

    /* if we didn't find the match, log an error and ignore the line */
    if (p_.getch() == '\0')
    {
        log_error(TCERR_BAD_INC_SYNTAX);
        clear_linebuf();
        return;
    }
    else
    {
        /*   
         *   We found the close quote.  Before we parse the filename, make
         *   one last check: if there's anything further on the line apart
         *   from whitespace, it's extraneous, so issue a warning.  
         */

        /* remember where the close quote is */
        utf8_ptr closep = p_;
        
        /* skip it, and then skip any trailing whitespace */
        for (p_.inc() ; is_space(p_.getch()) ; p_.inc()) ;

        /* if we're not at the end of the line, issue a warning */
        if (p_.getch() != '\0')
            log_warning(TCERR_EXTRA_INC_SYNTAX);

        /* 
         *   Null-terminate the filename.  (We know there's nothing else
         *   interesting in the buffer after the filename at this point, so
         *   we don't care about overwriting the quote or anything that might
         *   come after it.)  
         */
        closep.setch('\0');
    }

    /* check to see if the filename is absolute */
    is_absolute = os_is_file_absolute(fname.getptr());

    /* we have yet to find the file */
    found = FALSE;

    /* 
     *   in case the name is in portable URL notation, convert from URL
     *   notation to local notation; we'll consider this form of the name
     *   first, and only if we can't find it in this form will we try
     *   treating the name as using local filename conventions 
     */
    os_cvt_url_dir(lcl_name, sizeof(lcl_name), fname.getptr());

    /*
     *   Search for the included file.
     *   
     *   First, if it's a local file (in quotes rather than angle
     *   brackets), start the search in the directory containing the
     *   current file, then look in the directory containing the parent
     *   file, and so on.  If we fail to find it, proceed as for a
     *   non-local file.
     */
    if (is_local && last_desc_ != 0)
    {
        CTcTokStream *cur_str;
        char pathbuf[OSFNMAX];
        
        /* start with the current file, and search parents */
        for (cur_str = str_ ; cur_str != 0 ; cur_str = cur_str->get_parent())
        {
            /* get the path to the current file */
            os_get_path_name(pathbuf, sizeof(pathbuf),
                             last_desc_->get_fname());

            /* 
             *   try the URL-converted name first - this takes precedence
             *   over a local interpretation of the name 
             */
            os_build_full_path(full_name, sizeof(full_name),
                               pathbuf, lcl_name);
            if (!osfacc(full_name))
            {
                found = TRUE;
                break;
            }

            /* if it's a relative local name, try again with local naming */
            if (!is_absolute)
            {
                /* 
                 *   build the full filename, treating the name as using
                 *   local system conventions 
                 */
                os_build_full_path(full_name, sizeof(full_name),
                                   pathbuf, fname.getptr());
                
                /* if we found it, so note and stop searching */
                if (!osfacc(full_name))
                {
                    found = TRUE;
                    break;
                }
            }
        }
    }

    /*
     *   If we still haven't found the file (or if it's a non-local file,
     *   in angle brackets), search the include path.
     */
    if (!found)
    {
        tctok_incpath_t *inc_path;
        
        /* scan the include path */
        for (inc_path = incpath_head_ ; inc_path != 0 ;
             inc_path = inc_path->nxt)
        {
            /* try the URL-converted local name first */
            os_build_full_path(full_name, sizeof(full_name),
                               inc_path->path, lcl_name);
            if (!osfacc(full_name))
            {
                found = TRUE;
                break;
            }

            /* try with the local name, if it's a relative local name */
            if (!is_absolute)
            {
                /* build the full name for the file in this directory */
                os_build_full_path(full_name, sizeof(full_name),
                                   inc_path->path, fname.getptr());
                
                /* if we found it, stop searching */
                if (!osfacc(full_name))
                {
                    found = TRUE;
                    break;
                }
            }
        }
    }

    /* 
     *   If the filename specified an absolute path, and we didn't find a
     *   file with any of the local interpretations, look at the absolute
     *   path.  Note that our portable URL-style notation doesn't allow
     *   absolute notation, so we use only the exact name as specified in
     *   the #include directive as the absolute form.  
     */
    if (is_absolute && !found)
    {
        /* use the original filename as the full name */
        strcpy(full_name, fname.getptr());

        /* try finding the file */
        found = !osfacc(full_name);
    }

    /* 
     *   we have our copy of the filename now; we don't want to retain
     *   this directive in the preprocessed source, so clear out the line
     *   buffer now 
     */
    clear_linebuf();

    /* 
     *   if we didn't find the file anywhere, show an error and ignore the
     *   #include directive 
     */
    if (!found)
    {
        log_error(TCERR_INC_NOT_FOUND,
                  (int)strlen(fname.getptr()), fname.getptr());
        return;
    }
    
    /*
     *   Check the list of included files that are marked for inclusion
     *   only once.  If we've already included this file, ignore this
     *   redundant inclusion.  Check based on the full filename that we
     *   resolved from the search path.  
     */
    if (find_include_once(full_name))
    {
        /* log an error if appropriate */
        if (warn_on_ignore_incl_)
            log_warning(TCERR_REDUNDANT_INCLUDE,
                        (int)strlen(full_name), full_name);
        
        /* ignore this #include directive */
        return;
    }

    /* open a file source to read the file */
    new_src = CTcSrcFile::open_source(full_name, res_loader_,
                                      default_charset_, &charset_error,
                                      &default_charset_error);

    /* if we couldn't open the file, log an error and ignore the line */
    if (new_src == 0)
    {
        /* 
         *   if the error was due to the default character set, log that
         *   problem; otherwise, log the general file-open problem 
         */
        if (default_charset_error)
            log_error(TCERR_CANT_LOAD_DEFAULT_CHARSET, default_charset_);
        else
            log_error(TCERR_INC_NOT_FOUND,
                      (int)strlen(full_name), full_name);

        /* we can go no further */
        return;
    }

    /* get the descriptor for the source file */
    desc = get_file_desc(full_name, strlen(full_name), FALSE,
                         fname.getptr(),
                         fname.getptr() != 0 ? strlen(fname.getptr()) : 0);

    /* 
     *   remember the current #pragma newline_spacing mode, so we can restore
     *   it when we reinstate the current stream 
     */
    str_->set_newline_spacing(string_newline_spacing_);

    /* 
     *   Create and install the new file reader stream object.  By
     *   installing it as the current reader, we'll activate it so that
     *   the next line read will come from the new stream.  Note that the
     *   current stream becomes the parent of the new stream, so that we
     *   revert to the current stream when the new stream is exhausted;
     *   this will allow us to pick up reading from the current stream at
     *   the next line after the #include directive when we've finished
     *   including the new file.  
     */
    str_ = new CTcTokStream(desc, new_src, str_, charset_error, if_sp_);

    /*
     *   If we're in ALL_ONCE mode, it means that every single file we
     *   include should be included only once. 
     */
    if (all_once_)
        add_include_once(full_name);

    /* 
     *   if we're in list-includes mode, write the name of the include file
     *   to the standard output 
     */
    if (list_includes_mode_)
        G_hostifc->print_msg("#include %s\n", full_name);
}